

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

unsigned_long __thiscall CSSColorMap::GetRGBForColorName(CSSColorMap *this,string *inColorName)

{
  int iVar1;
  iterator iVar2;
  unsigned_long uVar3;
  size_type sVar4;
  string key;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)inColorName);
  for (sVar4 = 0; local_40._M_string_length != sVar4; sVar4 = sVar4 + 1) {
    iVar1 = tolower((int)local_40._M_dataplus._M_p[sVar4]);
    local_40._M_dataplus._M_p[sVar4] = (char)iVar1;
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)this,&local_40);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->mColorMap)._M_t._M_impl.super__Rb_tree_header) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(unsigned_long *)(iVar2._M_node + 2);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return uVar3;
}

Assistant:

unsigned long CSSColorMap::GetRGBForColorName(const std::string& inColorName)
{
    std::string key = inColorName;
    
    // convert to lower case, to match against color names
    std::transform(key.begin(), key.end(), key.begin(), ::tolower);
    
    StringToULongMap::iterator it = mColorMap.find(key);
    
    if(it == mColorMap.end())
        return 0;
    else
        return it->second;
}